

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_bitstream.c
# Opt level: O0

UWORD32 ihevcd_bits_nxt32(bitstrm_t *ps_bitstrm,UWORD32 u4_numbits)

{
  uint local_14;
  UWORD32 u4_bits_read;
  UWORD32 u4_numbits_local;
  bitstrm_t *ps_bitstrm_local;
  
  if (0x20 - ps_bitstrm->u4_bit_ofst < 0x20) {
    local_14 = ps_bitstrm->u4_nxt_word >> (0x20U - (char)ps_bitstrm->u4_bit_ofst & 0x1f);
  }
  else {
    local_14 = 0;
  }
  return local_14 | ps_bitstrm->u4_cur_word << ((byte)ps_bitstrm->u4_bit_ofst & 0x1f);
}

Assistant:

UWORD32 ihevcd_bits_nxt32(bitstrm_t *ps_bitstrm, UWORD32 u4_numbits)
{
    UWORD32 u4_bits_read;
    UNUSED(u4_numbits);
    BITS_NXT32(u4_bits_read,
               ps_bitstrm->pu4_buf,
               ps_bitstrm->u4_bit_ofst,
               ps_bitstrm->u4_cur_word,
               ps_bitstrm->u4_nxt_word);
    return u4_bits_read;
}